

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_set_dirty_m68k(CPUState *cpu,target_ulong_conflict vaddr)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  pvVar1 = cpu->env_ptr;
  uVar3 = vaddr & 0xfffff000;
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    lVar5 = *(long *)((long)pvVar1 + lVar7 * 0x10 + -0x28);
    uVar6 = (ulong)((*(uint *)((long)pvVar1 + lVar7 * 0x10 + -0x30) >> 6 & vaddr >> 0xc) << 6);
    if (*(int *)(lVar5 + 4 + uVar6) == uVar3 + 0x400) {
      *(uint *)(uVar6 + lVar5 + 4) = uVar3;
    }
    lVar7 = 1;
    bVar2 = false;
  } while (bVar4);
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    lVar7 = lVar7 * 0x2b0 + -0x564;
    lVar5 = 0;
    do {
      if (*(int *)((long)pvVar1 + lVar5 + lVar7) == uVar3 + 0x400) {
        *(uint *)((long)pvVar1 + lVar5 + lVar7) = uVar3;
      }
      lVar5 = lVar5 + 0x40;
    } while (lVar5 != 0x200);
    lVar7 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void tlb_set_dirty(CPUState *cpu, target_ulong vaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    // assert_cpu_is_self(cpu);

    vaddr &= TARGET_PAGE_MASK;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        tlb_set_dirty1_locked(tlb_entry(env, mmu_idx, vaddr), vaddr);
    }

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        int k;
        for (k = 0; k < CPU_VTLB_SIZE; k++) {
            tlb_set_dirty1_locked(&env_tlb(env)->d[mmu_idx].vtable[k], vaddr);
        }
    }
}